

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O3

altsvc * altsvc_createid(char *srchost,size_t hlen,char *dsthost,size_t dlen,alpnid srcalpnid,
                        alpnid dstalpnid,size_t srcport,size_t dstport)

{
  altsvc *paVar1;
  char *pcVar2;
  
  paVar1 = (altsvc *)(*Curl_ccalloc)(1,0x50);
  if (paVar1 == (altsvc *)0x0) {
    return (altsvc *)0x0;
  }
  if (dlen != 0 && hlen != 0) {
    if ((hlen < 3) || (*srchost != '[')) {
      if ((srchost[hlen - 1] == '.') && (hlen = hlen - 1, hlen == 0)) goto LAB_0011185f;
    }
    else {
      srchost = srchost + 1;
      hlen = hlen - 2;
    }
    if ((2 < dlen) && (*dsthost == '[')) {
      dsthost = dsthost + 1;
      dlen = dlen - 2;
    }
    pcVar2 = (char *)Curl_memdup0(srchost,hlen);
    (paVar1->src).host = pcVar2;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = (char *)Curl_memdup0(dsthost,dlen);
      (paVar1->dst).host = pcVar2;
      if (pcVar2 != (char *)0x0) {
        (paVar1->src).alpnid = srcalpnid;
        (paVar1->dst).alpnid = dstalpnid;
        (paVar1->src).port = (unsigned_short)srcport;
        (paVar1->dst).port = (unsigned_short)dstport;
        return paVar1;
      }
    }
  }
LAB_0011185f:
  (*Curl_cfree)((paVar1->src).host);
  (*Curl_cfree)((paVar1->dst).host);
  (*Curl_cfree)(paVar1);
  return (altsvc *)0x0;
}

Assistant:

static struct altsvc *altsvc_createid(const char *srchost,
                                      size_t hlen,
                                      const char *dsthost,
                                      size_t dlen, /* dsthost length */
                                      enum alpnid srcalpnid,
                                      enum alpnid dstalpnid,
                                      size_t srcport,
                                      size_t dstport)
{
  struct altsvc *as = calloc(1, sizeof(struct altsvc));
  if(!as)
    return NULL;
  DEBUGASSERT(hlen);
  DEBUGASSERT(dlen);
  if(!hlen || !dlen)
    /* bad input */
    goto error;
  if((hlen > 2) && srchost[0] == '[') {
    /* IPv6 address, strip off brackets */
    srchost++;
    hlen -= 2;
  }
  else if(srchost[hlen - 1] == '.') {
    /* strip off trailing dot */
    hlen--;
    if(!hlen)
      goto error;
  }
  if((dlen > 2) && dsthost[0] == '[') {
    /* IPv6 address, strip off brackets */
    dsthost++;
    dlen -= 2;
  }

  as->src.host = Curl_memdup0(srchost, hlen);
  if(!as->src.host)
    goto error;

  as->dst.host = Curl_memdup0(dsthost, dlen);
  if(!as->dst.host)
    goto error;

  as->src.alpnid = srcalpnid;
  as->dst.alpnid = dstalpnid;
  as->src.port = (unsigned short)srcport;
  as->dst.port = (unsigned short)dstport;

  return as;
error:
  altsvc_free(as);
  return NULL;
}